

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O3

packet_t * parse_pkt(uint8_t *data,int len)

{
  uint8_t uVar1;
  int iVar2;
  packet_t *ppVar3;
  uint8_t *puVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ushort *puVar9;
  ushort uVar10;
  double in_XMM0_Qa;
  double __x;
  double __x_00;
  
  if (data == (uint8_t *)0x0) {
    _log(in_XMM0_Qa);
    return (packet_t *)0x0;
  }
  ppVar3 = (packet_t *)new(0x60);
  ppVar3->len = len;
  ppVar3->payload = len;
  puVar4 = (uint8_t *)new((long)len);
  ppVar3->data = puVar4;
  memcpy(puVar4,data,(long)len);
  __x_00 = __x;
  if (ppVar3->len < 0xe) {
    __x_00 = _log(__x);
  }
  puVar4 = ppVar3->data;
  iVar7 = ppVar3->offset;
  ppVar3->eth = (eth_t *)(puVar4 + iVar7);
  iVar2 = iVar7 + 0xe;
  ppVar3->offset = iVar2;
  iVar8 = ppVar3->payload;
  ppVar3->payload = iVar8 + -0xe;
  puVar9 = (ushort *)(puVar4 + (long)iVar7 + 2);
  uVar10 = *(ushort *)(puVar4 + (long)iVar7 + 0xc) << 8 |
           *(ushort *)(puVar4 + (long)iVar7 + 0xc) >> 8;
  ppVar3->eth_type = uVar10;
  iVar8 = iVar8 + -0x12;
  do {
    iVar7 = iVar8 + 4;
    if (uVar10 < 0x9100) {
      if ((uVar10 != 0x8100) && (uVar10 != 0x88a8)) {
        if (uVar10 != 0x800) {
          return ppVar3;
        }
        if (iVar7 < 0x14) {
          __x_00 = _log(__x_00);
          iVar2 = ppVar3->offset;
          iVar7 = ppVar3->payload;
          puVar4 = ppVar3->data;
        }
        ppVar3->ip = (ip_t *)(puVar4 + iVar2);
        iVar8 = (puVar4[iVar2] & 0xf) * 4;
        iVar6 = iVar7 + (puVar4[iVar2] & 0xf) * -4;
        if (SBORROW4(iVar7,iVar8) != iVar6 < 0) goto LAB_0010573b;
        iVar8 = iVar2 + iVar8;
        ppVar3->offset = iVar8;
        ppVar3->payload = iVar6;
        uVar1 = ((ip_t *)(puVar4 + iVar2))->proto;
        ppVar3->ip_proto = uVar1;
        if (uVar1 == '\x11') {
          if (iVar6 < 8) {
            _log(__x_00);
            iVar8 = ppVar3->offset;
            iVar6 = ppVar3->payload;
            puVar4 = ppVar3->data;
          }
          ppVar3->udp = (udp_t *)(puVar4 + iVar8);
          ppVar3->offset = iVar8 + 8;
          iVar7 = iVar6 + -8;
        }
        else {
          if (uVar1 != '\x06') {
            return ppVar3;
          }
          if (iVar6 < 0x14) {
            __x_00 = _log(__x_00);
            iVar8 = ppVar3->offset;
            iVar6 = ppVar3->payload;
            puVar4 = ppVar3->data;
          }
          ppVar3->tcp = (tcp_t *)(puVar4 + iVar8);
          uVar5 = puVar4[(long)iVar8 + 0xc] >> 2 & 0x3c;
          iVar7 = iVar6 - uVar5;
          if (iVar6 < (int)uVar5) {
LAB_0010573b:
            _log(__x_00);
            return ppVar3;
          }
          ppVar3->offset = iVar8 + uVar5;
        }
        ppVar3->payload = iVar7;
        return ppVar3;
      }
    }
    else if ((uVar10 != 0x9200) && (uVar10 != 0x9100)) {
      return ppVar3;
    }
    if (iVar7 < 4) goto LAB_0010573b;
    uVar10 = *puVar9 << 8 | *puVar9 >> 8;
    ppVar3->eth_type = uVar10;
    iVar2 = iVar2 + 4;
    ppVar3->offset = iVar2;
    ppVar3->payload = iVar8;
    iVar8 = iVar8 + -4;
    puVar9 = puVar9 + 2;
  } while( true );
}

Assistant:

packet_t *parse_pkt(const uint8_t *data, int len)
{
	if (0 > len && len > 65535) {
		log_err("%s packet len %d is invalid\n", __FUNCTION__, len);
		return NULL;
	}

	if (!data) {
		log_err("%s data is null\n",  __FUNCTION__);
		return NULL;
	}

	packet_t *pkt = _new(packet_t);
	pkt->len = len;
	pkt->payload = len;
	pkt->data = new(len);
	memcpy(pkt->data, data, len);
	parse_eth(pkt);

	return pkt;
}